

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O0

void __thiscall Deck::createDeck(Deck *this)

{
  result_type_conflict1 rVar1;
  vector<CardType,_std::allocator<CardType>_> *this_00;
  random_device local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13c0;
  __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_> local_38;
  __normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_> local_30;
  undefined1 local_28 [8];
  vector<CardType,_std::allocator<CardType>_> deck;
  Deck *this_local;
  
  deck.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  populateDeck((vector<CardType,_std::allocator<CardType>_> *)local_28,this);
  local_30._M_current =
       (CardType *)
       std::vector<CardType,_std::allocator<CardType>_>::begin
                 ((vector<CardType,_std::allocator<CardType>_> *)local_28);
  local_38._M_current =
       (CardType *)
       std::vector<CardType,_std::allocator<CardType>_>::end
                 ((vector<CardType,_std::allocator<CardType>_> *)local_28);
  std::random_device::random_device(&local_2748);
  rVar1 = std::random_device::operator()(&local_2748);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13c0,(ulong)rVar1);
  std::
  shuffle<__gnu_cxx::__normal_iterator<CardType*,std::vector<CardType,std::allocator<CardType>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_30,local_38,&local_13c0);
  std::random_device::~random_device(&local_2748);
  this_00 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  std::vector<CardType,_std::allocator<CardType>_>::vector
            (this_00,(vector<CardType,_std::allocator<CardType>_> *)local_28);
  this->deckPointer = this_00;
  std::vector<CardType,_std::allocator<CardType>_>::~vector
            ((vector<CardType,_std::allocator<CardType>_> *)local_28);
  return;
}

Assistant:

void Deck::createDeck() {
    std::vector<CardType> deck = Deck::populateDeck();
    std::shuffle(deck.begin(), deck.end(), std::mt19937(std::random_device()()));
    deckPointer = new std::vector<CardType>(deck); //store value on the heap to avoid losing it
}